

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool IsBlockMutated(CBlock *block,bool check_witness_root)

{
  long lVar1;
  bool bVar2;
  Logger *pLVar3;
  long lVar4;
  pointer psVar5;
  pointer psVar6;
  pointer psVar7;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  SizeComputer local_a8;
  string local_a0;
  BlockValidationState state;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  bVar2 = CheckMerkleRoot(block,&state);
  if (!bVar2) {
    pLVar3 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar3,VALIDATION,Debug);
    bVar9 = true;
    if (!bVar2) goto LAB_00ae1e4b;
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (&local_a0,&state.super_ValidationState<BlockValidationResult>);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "IsBlockMutated";
    logging_function._M_len = 0xe;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x1008,VALIDATION,Debug,
               (ConstevalFormatString<1U>)0xfb2567,&local_a0);
LAB_00ae1b92:
    bVar9 = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00ae1e4b;
  }
  psVar5 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = psVar5;
  if (psVar5 != (block->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = CTransaction::IsCoinBase
                      ((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    if (bVar2) {
      bVar2 = CheckWitnessMalleation(block,check_witness_root,&state);
      if (bVar2) {
        bVar9 = false;
        goto LAB_00ae1e4b;
      }
      pLVar3 = LogInstance();
      bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar3,VALIDATION,Debug);
      bVar9 = true;
      if (!bVar2) goto LAB_00ae1e4b;
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                (&local_a0,&state.super_ValidationState<BlockValidationResult>);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x5e;
      logging_function_00._M_str = "IsBlockMutated";
      logging_function_00._M_len = 0xe;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_00,source_file_00,0x101c,VALIDATION,Debug,
                 (ConstevalFormatString<1U>)0xfb2567,&local_a0);
      goto LAB_00ae1b92;
    }
    psVar5 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar7 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  lVar8 = (long)psVar7 - (long)psVar5;
  if (0 < lVar8 >> 6) {
    lVar4 = (lVar8 >> 6) + 1;
    psVar5 = psVar5 + 2;
    do {
      psVar6 = psVar5;
      local_a8.nSize = 0;
      local_a0._M_dataplus._M_p = &TX_NO_WITNESS.allow_witness;
      local_a0._M_string_length = (size_type)&local_a8;
      SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
                (psVar6[-2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_a0,
                 &TX_NO_WITNESS);
      if (local_a8.nSize == 0x40) {
        psVar6 = psVar6 + -2;
        goto LAB_00ae1e45;
      }
      local_a8.nSize = 0;
      local_a0._M_dataplus._M_p = &TX_NO_WITNESS.allow_witness;
      local_a0._M_string_length = (size_type)&local_a8;
      SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
                (psVar6[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_a0,
                 &TX_NO_WITNESS);
      if (local_a8.nSize == 0x40) {
        psVar6 = psVar6 + -1;
        goto LAB_00ae1e45;
      }
      local_a8.nSize = 0;
      local_a0._M_dataplus._M_p = &TX_NO_WITNESS.allow_witness;
      local_a0._M_string_length = (size_type)&local_a8;
      SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
                ((psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 ,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_a0,&TX_NO_WITNESS);
      if (local_a8.nSize == 0x40) goto LAB_00ae1e45;
      local_a8.nSize = 0;
      local_a0._M_dataplus._M_p = &TX_NO_WITNESS.allow_witness;
      local_a0._M_string_length = (size_type)&local_a8;
      SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
                (psVar6[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_a0,&TX_NO_WITNESS);
      if (local_a8.nSize == 0x40) {
        psVar6 = psVar6 + 1;
        goto LAB_00ae1e45;
      }
      lVar4 = lVar4 + -1;
      lVar8 = lVar8 + -0x40;
      psVar5 = psVar6 + 4;
    } while (1 < lVar4);
    psVar5 = psVar6 + 2;
  }
  lVar8 = lVar8 >> 4;
  if (lVar8 == 1) {
LAB_00ae1dfe:
    local_a0._M_string_length = (size_type)&local_a8;
    local_a8.nSize = 0;
    local_a0._M_dataplus._M_p = &TX_NO_WITNESS.allow_witness;
    SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
              ((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_a0,&TX_NO_WITNESS);
    psVar6 = psVar5;
    if (local_a8.nSize != 0x40) {
      psVar6 = psVar7;
    }
  }
  else if (lVar8 == 2) {
LAB_00ae1dc3:
    local_a0._M_string_length = (size_type)&local_a8;
    local_a8.nSize = 0;
    local_a0._M_dataplus._M_p = &TX_NO_WITNESS.allow_witness;
    SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
              ((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_a0,&TX_NO_WITNESS);
    psVar6 = psVar5;
    if (local_a8.nSize != 0x40) {
      psVar5 = psVar5 + 1;
      goto LAB_00ae1dfe;
    }
  }
  else {
    psVar6 = psVar7;
    if (lVar8 == 3) {
      local_a0._M_string_length = (size_type)&local_a8;
      local_a8.nSize = 0;
      local_a0._M_dataplus._M_p = &TX_NO_WITNESS.allow_witness;
      SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
                ((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 ,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_a0,&TX_NO_WITNESS);
      psVar6 = psVar5;
      if (local_a8.nSize != 0x40) {
        psVar5 = psVar5 + 1;
        goto LAB_00ae1dc3;
      }
    }
  }
LAB_00ae1e45:
  bVar9 = psVar6 != psVar7;
LAB_00ae1e4b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
      &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
    operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus.
                    _M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.m_debug_message
                                  .field_2._M_allocated_capacity._1_7_,
                                  state.super_ValidationState<BlockValidationResult>.m_debug_message
                                  .field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
      &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2) {
    operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus.
                    _M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.m_reject_reason
                                  .field_2._M_allocated_capacity._1_7_,
                                  state.super_ValidationState<BlockValidationResult>.m_reject_reason
                                  .field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool IsBlockMutated(const CBlock& block, bool check_witness_root)
{
    BlockValidationState state;
    if (!CheckMerkleRoot(block, state)) {
        LogDebug(BCLog::VALIDATION, "Block mutated: %s\n", state.ToString());
        return true;
    }

    if (block.vtx.empty() || !block.vtx[0]->IsCoinBase()) {
        // Consider the block mutated if any transaction is 64 bytes in size (see 3.1
        // in "Weaknesses in Bitcoin’s Merkle Root Construction":
        // https://lists.linuxfoundation.org/pipermail/bitcoin-dev/attachments/20190225/a27d8837/attachment-0001.pdf).
        //
        // Note: This is not a consensus change as this only applies to blocks that
        // don't have a coinbase transaction and would therefore already be invalid.
        return std::any_of(block.vtx.begin(), block.vtx.end(),
                           [](auto& tx) { return GetSerializeSize(TX_NO_WITNESS(tx)) == 64; });
    } else {
        // Theoretically it is still possible for a block with a 64 byte
        // coinbase transaction to be mutated but we neglect that possibility
        // here as it requires at least 224 bits of work.
    }

    if (!CheckWitnessMalleation(block, check_witness_root, state)) {
        LogDebug(BCLog::VALIDATION, "Block mutated: %s\n", state.ToString());
        return true;
    }

    return false;
}